

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O1

void displayMessage(MessageType t,ostringstream *msg)

{
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  int in_ECX;
  long *plVar4;
  long lVar5;
  char *pcVar6;
  string stack;
  string local_80;
  long *local_60 [2];
  long local_50 [2];
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  if (t == AUTHOR_ERROR) {
    pcVar6 = "This error is for project developers. Use -Wno-error=dev to suppress it.";
    lVar5 = 0x48;
  }
  else {
    if (t != AUTHOR_WARNING) goto LAB_0015f9fe;
    pcVar6 = "This warning is for project developers.  Use -Wno-dev to suppress it.";
    lVar5 = 0x45;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)msg,pcVar6,lVar5);
LAB_0015f9fe:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)msg,"\n",1);
  if (t == INTERNAL_ERROR) {
    cmsys::SystemInformation::GetProgramStack_abi_cxx11_
              (&local_80,(SystemInformation *)0x0,0,in_ECX);
    if (local_80._M_string_length != 0) {
      iVar1 = strncmp(local_80._M_dataplus._M_p,"WARNING:",8);
      if (iVar1 == 0) {
        std::__cxx11::string::substr((ulong)local_60,(ulong)&local_80);
        plVar2 = (long *)std::__cxx11::string::replace((ulong)local_60,0,(char *)0x0,0x4dc108);
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_30 = *plVar4;
          lStack_28 = plVar2[3];
          local_40 = &local_30;
        }
        else {
          local_30 = *plVar4;
          local_40 = (long *)*plVar2;
        }
        local_38 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_80,(string *)&local_40);
        if (local_40 != &local_30) {
          operator_delete(local_40,local_30 + 1);
        }
        if (local_60[0] != local_50) {
          operator_delete(local_60[0],local_50[0] + 1);
        }
      }
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)msg,local_80._M_dataplus._M_p,local_80._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void displayMessage(MessageType t, std::ostringstream& msg)
{
  // Add a note about warning suppression.
  if (t == MessageType::AUTHOR_WARNING) {
    msg << "This warning is for project developers.  Use -Wno-dev to suppress "
           "it.";
  } else if (t == MessageType::AUTHOR_ERROR) {
    msg << "This error is for project developers. Use -Wno-error=dev to "
           "suppress "
           "it.";
  }

  // Add a terminating blank line.
  msg << "\n";

#if defined(CMAKE_BUILD_WITH_CMAKE)
  // Add a C++ stack trace to internal errors.
  if (t == MessageType::INTERNAL_ERROR) {
    std::string stack = cmsys::SystemInformation::GetProgramStack(0, 0);
    if (!stack.empty()) {
      if (cmHasLiteralPrefix(stack, "WARNING:")) {
        stack = "Note:" + stack.substr(8);
      }
      msg << stack << "\n";
    }
  }
#endif

  // Output the message.
  // if (t == MessageType::FATAL_ERROR || t == MessageType::INTERNAL_ERROR ||
  //     t == MessageType::DEPRECATION_ERROR || t == MessageType::AUTHOR_ERROR)
  //     {
  //   cmSystemTools::SetErrorOccured();
  //   cmSystemTools::Message(msg.str(), "Error");
  // } else {
  //   cmSystemTools::Message(msg.str(), "Warning");
  // }
}